

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleTextWidget::textAfterOffset(QAccessibleTextWidget *this)

{
  TextBoundaryType in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_R8;
  int *in_R9;
  
  textAfterOffset((QString *)this,(QAccessibleTextWidget *)(in_RSI + -0x20),in_EDX,in_ECX,in_R8,
                  in_R9);
  return;
}

Assistant:

QString QAccessibleTextWidget::textAfterOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                              int *startOffset, int *endOffset) const
{
    Q_ASSERT(startOffset);
    Q_ASSERT(endOffset);

    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    std::pair<int, int> boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);
    cursor.setPosition(boundaries.second);
    boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);

    *startOffset = boundaries.first;
    *endOffset = boundaries.second;

    return text(boundaries.first, boundaries.second);
}